

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathway.c
# Opt level: O2

pathway_mode_t parse_pathway_mode(char *value)

{
  switch(*value) {
  case '1':
    if (value[1] == '\0') {
      return PTMD_WALKWAY;
    }
    break;
  case '2':
    if (value[1] == '\0') {
      return PTMD_STAIRS;
    }
    break;
  case '3':
    if (value[1] == '\0') {
      return PTMD_MOVING;
    }
    break;
  case '4':
    if (value[1] == '\0') {
      return PTMD_ESCALATOR;
    }
    break;
  case '5':
    if (value[1] == '\0') {
      return PTMD_ELEVATOR;
    }
    break;
  case '6':
    return (uint)(value[1] != '\0') * 2 + PTMD_PAYGATE;
  case '7':
    return PTMD_NOT_SET - (value[1] == '\0');
  }
  return PTMD_NOT_SET;
}

Assistant:

pathway_mode_t parse_pathway_mode(const char *value) {
    if (strcmp(value, "1") == 0)
        return PTMD_WALKWAY;
    else if (strcmp(value, "2") == 0)
        return PTMD_STAIRS;
    else if (strcmp(value, "3") == 0)
        return PTMD_MOVING;
    else if (strcmp(value, "4") == 0)
        return PTMD_ESCALATOR;
    else if (strcmp(value, "5") == 0)
        return PTMD_ELEVATOR;
    else if (strcmp(value, "6") == 0)
        return PTMD_PAYGATE;
    else if (strcmp(value, "7") == 0)
        return PTMD_EXITGATE;
    else
        return PTMD_NOT_SET;
}